

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ErrorList.cpp
# Opt level: O3

void __thiscall
amrex::ErrorRec::ErrorRec(ErrorRec *this,string *nm,int ng,ErrorType etyp,ErrorFunc *f)

{
  pointer pcVar1;
  int iVar2;
  undefined4 extraout_var;
  
  this->_vptr_ErrorRec = (_func_int **)&PTR__ErrorRec_0080d278;
  (this->derive_name)._M_dataplus._M_p = (pointer)&(this->derive_name).field_2;
  pcVar1 = (nm->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->derive_name,pcVar1,pcVar1 + nm->_M_string_length);
  this->ngrow = ng;
  this->err_type = etyp;
  iVar2 = (**f->_vptr_ErrorFunc)(f);
  this->err_func = (ErrorFunc *)CONCAT44(extraout_var,iVar2);
  this->err_func2 = (ErrorFunc2 *)0x0;
  return;
}

Assistant:

ErrorRec::ErrorRec (const std::string&         nm,
                    int                        ng,
                    ErrorRec::ErrorType        etyp,
                    const ErrorRec::ErrorFunc& f)
    :
    derive_name(nm),
    ngrow(ng),
    err_type(etyp),
    err_func(f.clone()),
    err_func2(0)
{}